

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlGetListFromDictionaryByKey
                    (JlDataObject *DictionaryObject,char *KeyName,JlDataObject **pListObject)

{
  JlDataObject *local_30;
  JlDataObject *object;
  JlDataObject **ppJStack_20;
  JL_STATUS jlStatus;
  JlDataObject **pListObject_local;
  char *KeyName_local;
  JlDataObject *DictionaryObject_local;
  
  if (((DictionaryObject == (JlDataObject *)0x0) || (KeyName == (char *)0x0)) ||
     (pListObject == (JlDataObject **)0x0)) {
    object._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    *pListObject = (JlDataObject *)0x0;
    local_30 = (JlDataObject *)0x0;
    ppJStack_20 = pListObject;
    pListObject_local = (JlDataObject **)KeyName;
    KeyName_local = (char *)DictionaryObject;
    object._4_4_ = JlGetObjectFromDictionaryByKey(DictionaryObject,KeyName,&local_30);
    if (object._4_4_ == JL_STATUS_SUCCESS) {
      if (local_30->Type == JL_DATA_TYPE_LIST) {
        *ppJStack_20 = local_30;
      }
      else {
        object._4_4_ = JL_STATUS_WRONG_TYPE;
      }
    }
  }
  return object._4_4_;
}

Assistant:

JL_STATUS
    JlGetListFromDictionaryByKey
    (
        JlDataObject const*         DictionaryObject,
        char const*                 KeyName,
        JlDataObject**              pListObject
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  NULL != pListObject )
    {
        *pListObject = NULL;

        JlDataObject* object = NULL;
        jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, KeyName, &object );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            if( JL_DATA_TYPE_LIST == object->Type )
            {
                *pListObject = object;
            }
            else
            {
                jlStatus = JL_STATUS_WRONG_TYPE;
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}